

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

uint __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<char>>::count_digits<4u>
          (int_writer<unsigned_long,_fmt::v5::basic_format_specs<char>_> *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  uVar3 = this->abs_value;
  do {
    uVar2 = uVar2 + 1;
    bVar1 = 0xf < uVar3;
    uVar3 = uVar3 >> 4;
  } while (bVar1);
  return uVar2;
}

Assistant:

unsigned count_digits() const {
      unsigned_type n = abs_value;
      unsigned num_digits = 0;
      do {
        ++num_digits;
      } while ((n >>= BITS) != 0);
      return num_digits;
    }